

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestWithCustomGenerator.cpp
# Opt level: O0

vector<Rectangle,_std::allocator<Rectangle>_> * __thiscall
CustomGenerator::shrink(CustomGenerator *this,Rectangle *r)

{
  int iVar1;
  int w;
  int iVar2;
  Rectangle *in_RDX;
  vector<Rectangle,_std::allocator<Rectangle>_> *in_RDI;
  vector<Rectangle,_std::allocator<Rectangle>_> *ret;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Rectangle local_3c;
  Rectangle local_34 [3];
  undefined1 local_19;
  Rectangle *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::vector<Rectangle,_std::allocator<Rectangle>_>::vector
            ((vector<Rectangle,_std::allocator<Rectangle>_> *)0x115f3a);
  iVar1 = Rectangle::getWidth(local_18);
  if (1 < iVar1) {
    in_stack_ffffffffffffffa4 = Rectangle::getWidth(local_18);
    in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + -1;
    iVar1 = Rectangle::getHeight(local_18);
    Rectangle::Rectangle(local_34,in_stack_ffffffffffffffa4,iVar1);
    std::vector<Rectangle,_std::allocator<Rectangle>_>::push_back
              ((vector<Rectangle,_std::allocator<Rectangle>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (value_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  iVar1 = Rectangle::getHeight(local_18);
  if (1 < iVar1) {
    w = Rectangle::getWidth(local_18);
    iVar2 = Rectangle::getHeight(local_18);
    Rectangle::Rectangle(&local_3c,w,iVar2 + -1);
    std::vector<Rectangle,_std::allocator<Rectangle>_>::push_back
              ((vector<Rectangle,_std::allocator<Rectangle>_> *)
               CONCAT44(in_stack_ffffffffffffffa4,iVar1),(value_type *)CONCAT44(w,iVar2));
  }
  return in_RDI;
}

Assistant:

std::vector<Rectangle> shrink(const Rectangle& r) {
    std::vector<Rectangle> ret;
    if (r.getWidth() > 1)
      ret.push_back(Rectangle(r.getWidth() - 1, r.getHeight()));
    if (r.getHeight() > 1) {
      ret.push_back(Rectangle(r.getWidth(), r.getHeight() - 1));
    }
    return ret;
  }